

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  int iVar1;
  int iVar2;
  reference this_00;
  FieldGenerator *__p;
  Descriptor *in_RSI;
  Options *in_RDI;
  int i_1;
  int i;
  pointer in_stack_ffffffffffffff48;
  unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  size_type in_stack_ffffffffffffff68;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
  *in_stack_ffffffffffffff70;
  FieldDescriptor *field;
  int local_38;
  int local_34;
  
  *(Descriptor **)&in_RDI->expected_prefixes_path = in_RSI;
  field = (FieldDescriptor *)&(in_RDI->expected_prefixes_path)._M_string_length;
  Descriptor::field_count(in_RSI);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
  ::allocator((allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
               *)0x5ac7d6);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
  ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
           (allocator_type *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
  ::~allocator((allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
                *)0x5ac7f9);
  Descriptor::extension_count(in_RSI);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
  ::allocator((allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
               *)0x5ac837);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
  ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
           (allocator_type *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
  ::~allocator((allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>
                *)0x5ac85a);
  local_34 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(in_RSI);
    if (iVar1 <= local_34) break;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
                  *)&(in_RDI->expected_prefixes_path)._M_string_length,(long)local_34);
    Descriptor::field(in_RSI,local_34);
    FieldGenerator::Make(field,in_RDI);
    std::
    unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
    ::reset(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar1 = local_38;
    iVar2 = Descriptor::extension_count(in_RSI);
    if (iVar2 <= iVar1) break;
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
              ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
                            *)&in_RDI->expected_prefixes_suppressions,(long)local_38);
    Descriptor::extension(in_RSI,local_38);
    __p = FieldGenerator::Make(field,in_RDI);
    std::
    unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
    ::reset(this_00,__p);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      field_generators_(descriptor->field_count()),
      extension_generators_(descriptor->extension_count()) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        FieldGenerator::Make(descriptor->field(i), options));
  }
  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
        FieldGenerator::Make(descriptor->extension(i), options));
  }
}